

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlockfile.cpp
# Opt level: O0

bool __thiscall QLockFilePrivate::isApparentlyStale(QLockFilePrivate *this)

{
  duration<long,_std::ratio<1L,_1000L>_> __d;
  bool bVar1;
  long in_FS_OFFSET;
  bool sameHost;
  milliseconds age;
  QDateTime lastMod;
  QByteArray ourHostId;
  LockFileInfo info;
  undefined4 in_stack_fffffffffffffe58;
  Initialization in_stack_fffffffffffffe5c;
  undefined6 in_stack_fffffffffffffe60;
  undefined1 in_stack_fffffffffffffe66;
  undefined1 in_stack_fffffffffffffe67;
  QByteArray *in_stack_fffffffffffffe68;
  undefined6 in_stack_fffffffffffffe70;
  undefined1 in_stack_fffffffffffffe76;
  undefined1 in_stack_fffffffffffffe77;
  QString *in_stack_fffffffffffffe78;
  QFileInfo *in_stack_fffffffffffffe80;
  LockFileInfo *in_stack_fffffffffffffea0;
  undefined7 in_stack_fffffffffffffea8;
  undefined1 in_stack_fffffffffffffeaf;
  byte local_141;
  bool local_125;
  bool local_109;
  qint64 local_e8;
  undefined1 *local_e0 [3];
  undefined1 *local_c8;
  undefined1 *local_a8;
  undefined1 *puStack_a0;
  undefined1 *local_98;
  undefined1 *local_78;
  undefined1 *puStack_70;
  undefined1 *local_68;
  undefined1 *puStack_60;
  undefined1 *local_58;
  undefined1 *puStack_50;
  undefined1 *local_48;
  undefined1 *puStack_40;
  undefined1 *local_38;
  undefined1 *puStack_30;
  undefined1 *local_28;
  undefined1 *puStack_20;
  undefined1 *local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  local_28 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_20 = &DAT_aaaaaaaaaaaaaaaa;
  local_38 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_30 = &DAT_aaaaaaaaaaaaaaaa;
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
  local_68 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
  local_78 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_70 = &DAT_aaaaaaaaaaaaaaaa;
  anon_unknown.dwarf_3533c8::LockFileInfo::LockFileInfo
            ((LockFileInfo *)
             CONCAT17(in_stack_fffffffffffffe67,
                      CONCAT16(in_stack_fffffffffffffe66,in_stack_fffffffffffffe60)));
  bVar1 = getLockInfo_helper((QString *)
                             CONCAT17(in_stack_fffffffffffffeaf,in_stack_fffffffffffffea8),
                             in_stack_fffffffffffffea0);
  if (bVar1) {
    bVar1 = QString::isEmpty((QString *)0x2cf43f);
    local_141 = 1;
    if (!bVar1) {
      machineName();
      local_141 = ::operator==((QString *)
                               CONCAT17(in_stack_fffffffffffffe67,
                                        CONCAT16(in_stack_fffffffffffffe66,in_stack_fffffffffffffe60
                                                )),
                               (QString *)
                               CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
      QString::~QString((QString *)0x2cf4af);
    }
    local_125 = (bool)(local_141 & 1);
    bVar1 = QByteArray::isEmpty((QByteArray *)0x2cf4cd);
    if (!bVar1) {
      local_a8 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_a0 = &DAT_aaaaaaaaaaaaaaaa;
      local_98 = &DAT_aaaaaaaaaaaaaaaa;
      QSysInfo::machineUniqueId();
      bVar1 = QByteArray::isEmpty((QByteArray *)0x2cf512);
      if (!bVar1) {
        local_125 = ::operator==((QByteArray *)
                                 CONCAT17(in_stack_fffffffffffffe77,
                                          CONCAT16(in_stack_fffffffffffffe76,
                                                   in_stack_fffffffffffffe70)),
                                 in_stack_fffffffffffffe68);
      }
      QByteArray::~QByteArray((QByteArray *)0x2cf564);
    }
    if (local_125 != false) {
      bVar1 = QByteArray::isEmpty((QByteArray *)0x2cf583);
      if (!bVar1) {
        QSysInfo::bootUniqueId();
        bVar1 = ::operator!=((QByteArray *)in_stack_fffffffffffffe78,
                             (QByteArray *)
                             CONCAT17(in_stack_fffffffffffffe77,
                                      CONCAT16(in_stack_fffffffffffffe76,in_stack_fffffffffffffe70))
                            );
        QByteArray::~QByteArray((QByteArray *)0x2cf5c6);
        if (bVar1) {
          local_109 = true;
          goto LAB_002cf859;
        }
      }
      bVar1 = isProcessRunning((qint64)in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
      if (!bVar1) {
        local_109 = true;
        goto LAB_002cf859;
      }
    }
  }
  local_c8 = &DAT_aaaaaaaaaaaaaaaa;
  QFileInfo::QFileInfo(in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
  QTimeZone::QTimeZone
            ((QTimeZone *)
             CONCAT17(in_stack_fffffffffffffe67,
                      CONCAT16(in_stack_fffffffffffffe66,in_stack_fffffffffffffe60)),
             in_stack_fffffffffffffe5c);
  QFileInfo::lastModified
            ((QFileInfo *)in_stack_fffffffffffffe68,
             (QTimeZone *)
             CONCAT17(in_stack_fffffffffffffe67,
                      CONCAT16(in_stack_fffffffffffffe66,in_stack_fffffffffffffe60)));
  QTimeZone::~QTimeZone((QTimeZone *)0x2cf68b);
  QFileInfo::~QFileInfo((QFileInfo *)0x2cf698);
  local_e0[0] = &DAT_aaaaaaaaaaaaaaaa;
  QDateTime::currentDateTimeUtc();
  local_e8 = QDateTime::msecsTo((QDateTime *)in_stack_fffffffffffffe68,
                                (QDateTime *)
                                CONCAT17(in_stack_fffffffffffffe67,
                                         CONCAT16(in_stack_fffffffffffffe66,
                                                  in_stack_fffffffffffffe60)));
  std::chrono::duration<long,std::ratio<1l,1000l>>::duration<long_long,void>
            ((duration<long,std::ratio<1l,1000l>> *)local_e0,&local_e8);
  QDateTime::~QDateTime((QDateTime *)0x2cf706);
  ms<(char)48>();
  bVar1 = std::chrono::operator>
                    ((duration<long,_std::ratio<1L,_1000L>_> *)
                     CONCAT17(in_stack_fffffffffffffe67,
                              CONCAT16(in_stack_fffffffffffffe66,in_stack_fffffffffffffe60)),
                     (duration<long,_std::ratio<1L,_1000L>_> *)
                     CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
  local_109 = false;
  if (bVar1) {
    __d.__r._6_1_ = in_stack_fffffffffffffe66;
    __d.__r._0_6_ = in_stack_fffffffffffffe60;
    __d.__r._7_1_ = in_stack_fffffffffffffe67;
    std::chrono::abs<long,std::ratio<1l,1000l>>(__d);
    in_stack_fffffffffffffe67 =
         std::chrono::operator>
                   ((duration<long,_std::ratio<1L,_1000L>_> *)
                    CONCAT17(in_stack_fffffffffffffe67,
                             CONCAT16(in_stack_fffffffffffffe66,in_stack_fffffffffffffe60)),
                    (duration<long,_std::ratio<1L,_1000L>_> *)
                    CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
    local_109 = (bool)in_stack_fffffffffffffe67;
  }
  QDateTime::~QDateTime((QDateTime *)0x2cf7cf);
LAB_002cf859:
  anon_unknown.dwarf_3533c8::LockFileInfo::~LockFileInfo
            ((LockFileInfo *)
             CONCAT17(in_stack_fffffffffffffe67,
                      CONCAT16(in_stack_fffffffffffffe66,in_stack_fffffffffffffe60)));
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_109;
  }
  __stack_chk_fail();
}

Assistant:

bool QLockFilePrivate::isApparentlyStale() const
{
    LockFileInfo info;
    if (getLockInfo_helper(fileName, &info)) {
        bool sameHost = info.hostname.isEmpty() || info.hostname == machineName();
        if (!info.hostid.isEmpty()) {
            // Override with the host ID, if we know it.
            QByteArray ourHostId = QSysInfo::machineUniqueId();
            if (!ourHostId.isEmpty())
                sameHost = (ourHostId == info.hostid);
        }

        if (sameHost) {
            if (!info.bootid.isEmpty()) {
                // If we've rebooted, then the lock is definitely stale.
                if (info.bootid != QSysInfo::bootUniqueId())
                    return true;
            }
            if (!isProcessRunning(info.pid, info.appname))
                return true;
        }
    }

    const QDateTime lastMod = QFileInfo(fileName).lastModified(QTimeZone::UTC);
    using namespace std::chrono;
    const milliseconds age{lastMod.msecsTo(QDateTime::currentDateTimeUtc())};
    return staleLockTime > 0ms && abs(age) > staleLockTime;
}